

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

char * QtPrivate::QTypeNormalizer::skipTemplate(char *x,char *e,bool stopAtComa)

{
  bool bVar1;
  byte in_DL;
  char *in_RSI;
  char *in_RDI;
  int templateDepth;
  int scopeDepth;
  int local_24;
  int local_20;
  char *local_10;
  
  local_20 = 0;
  local_24 = 0;
  local_10 = in_RDI;
LAB_0014459a:
  do {
    if (local_10 == in_RSI) {
      return local_10;
    }
    switch(*local_10) {
    case '\"':
      goto switchD_001445d8_caseD_22;
    case '\'':
      bVar1 = is_number(local_10[-1]);
      if (bVar1) break;
      goto switchD_001445d8_caseD_22;
    case '(':
    case '[':
    case '{':
      local_20 = local_20 + 1;
      break;
    case ')':
    case ']':
    case '}':
      local_20 = local_20 + -1;
      break;
    case ',':
      if ((((in_DL & 1) != 0) && (local_20 == 0)) && (local_24 == 0)) {
        return local_10;
      }
      break;
    case '<':
      if (local_20 == 0) {
        local_24 = local_24 + 1;
      }
      break;
    case '>':
      if ((local_20 == 0) && (local_24 = local_24 + -1, local_24 < 0)) {
        return local_10;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
switchD_001445d8_caseD_22:
  local_10 = skipString(local_10,in_RSI);
  goto LAB_0014459a;
}

Assistant:

static constexpr const char *skipTemplate(const char *x, const char *e, bool stopAtComa = false)
    {
        int scopeDepth = 0;
        int templateDepth = 0;
        while (x != e) {
            switch (*x) {
            case '<':
                if (!scopeDepth)
                    templateDepth++;
                break;
            case ',':
                if (stopAtComa && !scopeDepth && !templateDepth)
                    return x;
                break;
            case '>':
                if (!scopeDepth)
                    if (--templateDepth < 0)
                        return x;
                break;
            case '(':
            case '[':
            case '{':
                scopeDepth++;
                break;
            case '}':
            case ']':
            case ')':
                scopeDepth--;
                break;
            case '\'':
                if (is_number(x[-1]))
                    break;
                Q_FALLTHROUGH();
            case '\"':
                x = skipString(x, e);
                continue;
            }
            x++;
        }
        return x;
    }